

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

TracedValue * __thiscall
perfetto::TracedDictionary::AddItem
          (TracedValue *__return_storage_ptr__,TracedDictionary *this,char *param_3)

{
  EventContext *pEVar1;
  Message *this_00;
  allocator<char> local_49;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  this_00 = protozero::Message::BeginNestedMessageInternal(this->message_,this->field_id_);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,param_3,&local_49);
  protozero::Message::AppendBytes(this_00,10,local_48,local_40);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  pEVar1 = this->event_context_;
  __return_storage_ptr__->annotation_ = (DebugAnnotation *)this_00;
  __return_storage_ptr__->event_context_ = pEVar1;
  return __return_storage_ptr__;
}

Assistant:

TracedValue TracedDictionary::AddItem(DynamicString key) {
  PERFETTO_DCHECK(checked_scope_.is_active());
  protos::pbzero::DebugAnnotation* item =
      message_->BeginNestedMessage<protos::pbzero::DebugAnnotation>(field_id_);
  item->set_name(key.value);
  return TracedValue(item, event_context_, &checked_scope_);
}